

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void reset(int size)

{
  iterator __end1;
  list<MemBlock_*,_std::allocator<MemBlock_*>_> *plVar1;
  list<Process_*,_std::allocator<Process_*>_> *plVar2;
  MemBlock *free;
  
  plVar1 = &usedMemBlockList_abi_cxx11_;
  memSize = size;
  while (plVar1 = (list<MemBlock_*,_std::allocator<MemBlock_*>_> *)
                  (plVar1->super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>)._M_impl.
                  _M_node.super__List_node_base._M_next, plVar1 != &usedMemBlockList_abi_cxx11_) {
    operator_delete(*(_List_node_base **)((long)plVar1 + 0x10));
  }
  plVar1 = &freeMemBlockList_abi_cxx11_;
  while (plVar1 = (list<MemBlock_*,_std::allocator<MemBlock_*>_> *)
                  (plVar1->super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>)._M_impl.
                  _M_node.super__List_node_base._M_next, plVar1 != &freeMemBlockList_abi_cxx11_) {
    operator_delete(*(_List_node_base **)((long)plVar1 + 0x10));
  }
  plVar2 = &processList_abi_cxx11_;
  while (plVar2 = (list<Process_*,_std::allocator<Process_*>_> *)
                  (plVar2->super__List_base<Process_*,_std::allocator<Process_*>_>)._M_impl._M_node.
                  super__List_node_base._M_next, plVar2 != &processList_abi_cxx11_) {
    operator_delete(*(_List_node_base **)((long)plVar2 + 0x10));
  }
  std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::clear(&usedMemBlockList_abi_cxx11_);
  std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::clear(&freeMemBlockList_abi_cxx11_);
  std::__cxx11::list<Process_*,_std::allocator<Process_*>_>::clear(&processList_abi_cxx11_);
  free = (MemBlock *)operator_new(8);
  free->start = 0;
  free->length = memSize;
  std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::push_back
            (&freeMemBlockList_abi_cxx11_,&free);
  return;
}

Assistant:

void reset(int size) {
    // 首先将内存大小设置为size
    memSize = size;

    // 清空所有链表
    for (MemBlock *i : usedMemBlockList) delete i;
    for (MemBlock *i : freeMemBlockList) delete i;
    for (Process *i : processList) delete i;
    usedMemBlockList.clear();
    freeMemBlockList.clear();
    processList.clear();

    // 添加一块大小为size的空内存至链表
    MemBlock *free = new MemBlock;
    free->start = 0;
    free->length = memSize;
    freeMemBlockList.push_back(free);
}